

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# postscript.h
# Opt level: O2

void __thiscall Gecko::PostScript::edge(PostScript *this,Float xi,Float xj,Float weight,bool top)

{
  undefined7 in_register_00000031;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar2 = (double)ABS(xj - xi) * 0.5;
  dVar4 = dVar2 * dVar2;
  dVar3 = (dVar2 + dVar2 + -1.0) * dVar4;
  dVar2 = 100000.0;
  if (dVar3 <= 100000.0) {
    dVar2 = dVar3;
  }
  dVar3 = dVar4 / dVar2;
  if ((int)CONCAT71(in_register_00000031,top) == 0) {
    dVar5 = (double)xi;
    dVar2 = -dVar2;
    dVar1 = (double)xj;
  }
  else {
    dVar5 = (double)xj;
    dVar1 = (double)xi;
  }
  fprintf((FILE *)this->file,"%g 0 %g %g %g 0 %g %g A\n",dVar5,(double)((xi + xj) * 0.5),dVar2,dVar1
          ,SQRT(dVar3 * dVar3 + dVar4),(double)(weight * 0.25));
  return;
}

Assistant:

void edge(Float xi, Float xj, Float weight, bool top)
  {
    double x = (xi + xj) / 2;
    double d = fabs(xj - xi) / 2;
    double h = std::min(d * d * (2 * d - 1), 1e5);
    double y = d * d / h;
    double r = sqrt(d * d + y * y);
    weight /= 4;
    if (top)
      fprintf(file, "%g 0 %g %g %g 0 %g %g A\n", xj, x, +h, xi, r, weight);
    else
      fprintf(file, "%g 0 %g %g %g 0 %g %g A\n", xi, x, -h, xj, r, weight);
  }